

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow_p.h
# Opt level: O2

void __thiscall QMdiSubWindowPrivate::setNewGeometry(QMdiSubWindowPrivate *this,QRect *geometry)

{
  undefined4 uVar1;
  QSize QVar2;
  undefined4 uVar3;
  QWidget *this_00;
  QSize QVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QVar4 = QRect::size(geometry);
  QVar2 = this->internalMinimumSize;
  auVar6._8_8_ = 0;
  auVar6._0_4_ = QVar2.wd.m_i;
  auVar6._4_4_ = QVar2.ht.m_i;
  auVar7._0_8_ = CONCAT44(-(uint)(QVar2.ht.m_i.m_i < QVar4.ht.m_i.m_i),
                          -(uint)(QVar2.wd.m_i.m_i < QVar4.wd.m_i.m_i));
  auVar7._8_8_ = 0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (ulong)QVar4 & auVar7._0_8_;
  auVar5 = ~auVar7 & auVar6 | auVar5;
  uVar1 = geometry->x1;
  uVar3 = geometry->y1;
  geometry->x2 = (Representation)(uVar1 + -1 + auVar5._0_4_);
  geometry->y2 = (Representation)(uVar3 + -1 + auVar5._4_4_);
  if (this->isInRubberBandMode == true) {
    QRubberBand::setGeometry(this->rubberBand,geometry);
    return;
  }
  QWidget::setGeometry(this_00,geometry);
  return;
}

Assistant:

inline void setNewGeometry(QRect *geometry)
    {
        Q_Q(QMdiSubWindow);
        Q_ASSERT(parent);
        geometry->setSize(geometry->size().expandedTo(internalMinimumSize));
#if QT_CONFIG(rubberband)
        if (isInRubberBandMode)
            rubberBand->setGeometry(*geometry);
        else
#endif
            q->setGeometry(*geometry);
    }